

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void charmap_Add(char *mapping,uint8_t value)

{
  size_t sVar1;
  byte bVar2;
  Charnode *pCStack_28;
  uint8_t c;
  Charnode *node;
  Charmap *charmap;
  char *pcStack_10;
  uint8_t value_local;
  char *mapping_local;
  
  node = (Charnode *)*currentCharmap;
  pCStack_28 = (Charnode *)(node->next + 2);
  for (pcStack_10 = mapping; *pcStack_10 != '\0'; pcStack_10 = pcStack_10 + 1) {
    bVar2 = *pcStack_10 - 1;
    if (pCStack_28->next[bVar2] == 0) {
      pCStack_28->next[bVar2] = node->next[0];
      if (node->next[0] == node->next[1]) {
        node->next[1] = node->next[1] << 1;
        resizeCharmap(currentCharmap,node->next[1]);
        node = (Charnode *)*currentCharmap;
      }
      sVar1 = node->next[0];
      node->next[0] = sVar1 + 1;
      pCStack_28 = (Charnode *)(node[sVar1].next + 2);
      initNode(pCStack_28);
    }
    else {
      pCStack_28 = (Charnode *)(node[pCStack_28->next[bVar2]].next + 2);
    }
  }
  if ((pCStack_28->isTerminal & 1U) != 0) {
    warning(WARNING_CHARMAP_REDEF,"Overriding charmap mapping\n");
  }
  pCStack_28->isTerminal = true;
  pCStack_28->value = value;
  return;
}

Assistant:

void charmap_Add(char *mapping, uint8_t value)
{
	struct Charmap *charmap = *currentCharmap;
	struct Charnode *node = &charmap->nodes[0];

	for (uint8_t c; *mapping; mapping++) {
		c = *mapping - 1;

		if (node->next[c]) {
			node = &charmap->nodes[node->next[c]];
		} else {
			// Register next available node
			node->next[c] = charmap->usedNodes;
			// If no more nodes are available, get new ones
			if (charmap->usedNodes == charmap->capacity) {
				charmap->capacity *= 2;
				resizeCharmap(currentCharmap, charmap->capacity);
				charmap = *currentCharmap;
			}

			// Switch to and init new node
			node = &charmap->nodes[charmap->usedNodes++];
			initNode(node);
		}
	}

	if (node->isTerminal)
		warning(WARNING_CHARMAP_REDEF, "Overriding charmap mapping\n");

	node->isTerminal = true;
	node->value = value;
}